

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * __thiscall Omega_h::NegOp::eval(any *__return_storage_ptr__,NegOp *this,ExprEnv *env)

{
  Int dim;
  element_type *peVar1;
  any local_38;
  ExprEnv *local_20;
  ExprEnv *env_local;
  NegOp *this_local;
  
  dim = env->dim;
  local_20 = env;
  env_local = (ExprEnv *)this;
  this_local = (NegOp *)__return_storage_ptr__;
  peVar1 = std::__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->rhs);
  (*peVar1->_vptr_ExprOp[2])(&local_38,peVar1,local_20);
  anon_unknown_41::neg(__return_storage_ptr__,dim,&local_38);
  any::~any(&local_38);
  return __return_storage_ptr__;
}

Assistant:

any NegOp::eval(ExprEnv& env) { return neg(env.dim, rhs->eval(env)); }